

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.tweetnacl.c
# Opt level: O3

void cf_curve25519_mul(uint8_t *q,uint8_t *n,uint8_t *p)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  size_t i;
  long lVar4;
  bool bVar5;
  int i_1;
  uint uVar6;
  int iVar7;
  ulong *puVar8;
  ulong uVar9;
  ulong *puVar10;
  ulong uVar11;
  bool bVar12;
  byte bVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ulong uVar17;
  undefined1 auVar18 [16];
  gf a;
  uint8_t z [32];
  gf c;
  gf c_1;
  gf d;
  gf b;
  gf f;
  gf e;
  gf x;
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  ulong local_3e8;
  undefined7 uStack_3e0;
  undefined1 local_3d9;
  undefined7 uStack_3d8;
  undefined8 uStack_3d1;
  byte local_3c9;
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  ulong local_338 [15];
  ulong local_2c0;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  ulong local_238 [65];
  
  bVar13 = 0;
  uStack_3d8 = (undefined7)((ulong)*(undefined8 *)(n + 0xf) >> 8);
  uStack_3d1 = *(undefined8 *)(n + 0x17);
  uStack_3e0 = (undefined7)*(undefined8 *)(n + 8);
  local_3d9 = (undefined1)((ulong)*(undefined8 *)(n + 8) >> 0x38);
  local_3c9 = n[0x1f] & 0x3f | 0x40;
  local_3e8 = *(ulong *)n & 0xfffffffffffffff8;
  lVar4 = 0;
  do {
    local_238[lVar4 + 0x30] = (ulong)*(ushort *)(p + lVar4 * 2);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  local_238[0x3f] = local_238[0x3f] & 0x7fff;
  local_3b8 = (undefined1  [16])0x0;
  local_3a8 = (undefined1  [16])0x0;
  local_398 = (undefined1  [16])0x0;
  local_388 = (undefined1  [16])0x0;
  local_378 = (undefined1  [16])0x0;
  local_368 = (undefined1  [16])0x0;
  local_358 = (undefined1  [16])0x0;
  local_348 = (undefined1  [16])0x0;
  local_468 = (undefined1  [16])0x0;
  local_458 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_3f8 = (undefined1  [16])0x0;
  local_248 = (undefined1  [16])0x0;
  local_258 = (undefined1  [16])0x0;
  local_268 = (undefined1  [16])0x0;
  local_278 = (undefined1  [16])0x0;
  local_288 = (undefined1  [16])0x0;
  local_298 = (undefined1  [16])0x0;
  local_2a8 = (undefined1  [16])0x0;
  local_2b8 = (undefined1  [16])0x0;
  puVar8 = local_238 + 0x30;
  puVar10 = local_238;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar10 = *puVar8;
    puVar8 = puVar8 + 1;
    puVar10 = puVar10 + 1;
  }
  local_2b8 = ZEXT816(1);
  local_468 = ZEXT816(1);
  uVar6 = 0xfe;
  puVar8 = local_238 + 0x20;
  do {
    lVar4 = -(ulong)((*(byte *)((long)&local_3e8 + (ulong)(uVar6 >> 3)) >> (uVar6 & 7) & 1) != 0);
    local_3c8._8_4_ = (int)lVar4;
    local_3c8._0_8_ = lVar4;
    local_3c8._12_4_ = (int)((ulong)lVar4 >> 0x20);
    lVar4 = 0;
    do {
      auVar16 = *(undefined1 (*) [16])(local_238 + lVar4);
      auVar15 = (auVar16 ^ *(undefined1 (*) [16])(local_468 + lVar4 * 8)) & local_3c8;
      *(undefined1 (*) [16])(local_468 + lVar4 * 8) =
           *(undefined1 (*) [16])(local_468 + lVar4 * 8) ^ auVar15;
      *(undefined1 (*) [16])(local_238 + lVar4) = auVar15 ^ auVar16;
      lVar4 = lVar4 + 2;
    } while (lVar4 != 0x10);
    lVar4 = 0;
    do {
      auVar16 = (*(undefined1 (*) [16])(local_2b8 + lVar4 * 8) ^
                *(undefined1 (*) [16])(local_3b8 + lVar4 * 8)) & local_3c8;
      *(undefined1 (*) [16])(local_3b8 + lVar4 * 8) =
           *(undefined1 (*) [16])(local_3b8 + lVar4 * 8) ^ auVar16;
      *(undefined1 (*) [16])(local_2b8 + lVar4 * 8) =
           auVar16 ^ *(undefined1 (*) [16])(local_2b8 + lVar4 * 8);
      lVar4 = lVar4 + 2;
    } while (lVar4 != 0x10);
    lVar4 = 0;
    do {
      lVar1 = *(long *)(local_3b8 + lVar4 * 8 + 8);
      lVar2 = *(long *)(local_468 + lVar4 * 8 + 8);
      local_238[lVar4 + 0x20] = *(long *)(local_3b8 + lVar4 * 8) + *(long *)(local_468 + lVar4 * 8);
      local_238[lVar4 + 0x21] = lVar1 + lVar2;
      lVar4 = lVar4 + 2;
    } while (lVar4 != 0x10);
    lVar4 = 0;
    do {
      lVar1 = *(long *)(local_468 + lVar4 * 8 + 8);
      lVar2 = *(long *)(local_3b8 + lVar4 * 8 + 8);
      *(long *)(local_468 + lVar4 * 8) =
           *(long *)(local_468 + lVar4 * 8) - *(long *)(local_3b8 + lVar4 * 8);
      *(long *)(local_468 + lVar4 * 8 + 8) = lVar1 - lVar2;
      lVar4 = lVar4 + 2;
    } while (lVar4 != 0x10);
    lVar4 = 0;
    do {
      lVar1 = *(long *)(local_2b8 + lVar4 * 8 + 8);
      uVar9 = local_238[lVar4 + 1];
      *(ulong *)(local_3b8 + lVar4 * 8) = *(long *)(local_2b8 + lVar4 * 8) + local_238[lVar4];
      *(ulong *)(local_3b8 + lVar4 * 8 + 8) = lVar1 + uVar9;
      lVar4 = lVar4 + 2;
    } while (lVar4 != 0x10);
    lVar4 = 0;
    do {
      lVar1 = *(long *)(local_2b8 + lVar4 * 8 + 8);
      local_238[lVar4] = local_238[lVar4] - *(long *)(local_2b8 + lVar4 * 8);
      local_238[lVar4 + 1] = local_238[lVar4 + 1] - lVar1;
      lVar4 = lVar4 + 2;
    } while (lVar4 != 0x10);
    mul((int64_t *)local_2b8,(int64_t *)puVar8,(int64_t *)puVar8);
    mul((int64_t *)(local_238 + 0x10),(int64_t *)local_468,(int64_t *)local_468);
    mul((int64_t *)local_468,(int64_t *)local_3b8,(int64_t *)local_468);
    mul((int64_t *)local_3b8,(int64_t *)local_238,(int64_t *)puVar8);
    lVar4 = 0;
    do {
      lVar1 = *(long *)(local_3b8 + lVar4 * 8 + 8);
      lVar2 = *(long *)(local_468 + lVar4 * 8 + 8);
      local_238[lVar4 + 0x20] = *(long *)(local_3b8 + lVar4 * 8) + *(long *)(local_468 + lVar4 * 8);
      local_238[lVar4 + 0x21] = lVar1 + lVar2;
      lVar4 = lVar4 + 2;
    } while (lVar4 != 0x10);
    lVar4 = 0;
    do {
      lVar1 = *(long *)(local_468 + lVar4 * 8 + 8);
      lVar2 = *(long *)(local_3b8 + lVar4 * 8 + 8);
      *(long *)(local_468 + lVar4 * 8) =
           *(long *)(local_468 + lVar4 * 8) - *(long *)(local_3b8 + lVar4 * 8);
      *(long *)(local_468 + lVar4 * 8 + 8) = lVar1 - lVar2;
      lVar4 = lVar4 + 2;
    } while (lVar4 != 0x10);
    mul((int64_t *)local_238,(int64_t *)local_468,(int64_t *)local_468);
    lVar4 = 0;
    do {
      lVar1 = *(long *)(local_2b8 + lVar4 * 8 + 8);
      uVar9 = local_238[lVar4 + 0x11];
      *(ulong *)(local_3b8 + lVar4 * 8) = *(long *)(local_2b8 + lVar4 * 8) - local_238[lVar4 + 0x10]
      ;
      *(ulong *)(local_3b8 + lVar4 * 8 + 8) = lVar1 - uVar9;
      lVar4 = lVar4 + 2;
    } while (lVar4 != 0x10);
    mul((int64_t *)local_468,(int64_t *)local_3b8,_121665);
    lVar4 = 0;
    do {
      lVar1 = *(long *)(local_2b8 + lVar4 * 8 + 8);
      lVar2 = *(long *)(local_468 + lVar4 * 8 + 8);
      *(long *)(local_468 + lVar4 * 8) =
           *(long *)(local_2b8 + lVar4 * 8) + *(long *)(local_468 + lVar4 * 8);
      *(long *)(local_468 + lVar4 * 8 + 8) = lVar1 + lVar2;
      lVar4 = lVar4 + 2;
    } while (lVar4 != 0x10);
    mul((int64_t *)local_3b8,(int64_t *)local_3b8,(int64_t *)local_468);
    mul((int64_t *)local_468,(int64_t *)local_2b8,(int64_t *)(local_238 + 0x10));
    mul((int64_t *)local_2b8,(int64_t *)local_238,(int64_t *)(local_238 + 0x30));
    mul((int64_t *)local_238,(int64_t *)puVar8,(int64_t *)puVar8);
    lVar4 = 0;
    do {
      uVar3 = *(ulong *)(local_468 + lVar4 * 8 + 8);
      uVar9 = local_238[lVar4];
      uVar11 = local_238[lVar4 + 1];
      uVar14 = (uVar9 ^ *(ulong *)(local_468 + lVar4 * 8)) & local_3c8._0_8_;
      uVar17 = (uVar11 ^ uVar3) & local_3c8._8_8_;
      *(ulong *)(local_468 + lVar4 * 8) = *(ulong *)(local_468 + lVar4 * 8) ^ uVar14;
      *(ulong *)(local_468 + lVar4 * 8 + 8) = uVar3 ^ uVar17;
      local_238[lVar4] = uVar14 ^ uVar9;
      local_238[lVar4 + 1] = uVar17 ^ uVar11;
      lVar4 = lVar4 + 2;
    } while (lVar4 != 0x10);
    lVar4 = 0;
    do {
      uVar3 = *(ulong *)(local_3b8 + lVar4 * 8 + 8);
      uVar9 = *(ulong *)(local_2b8 + lVar4 * 8);
      uVar11 = *(ulong *)(local_2b8 + lVar4 * 8 + 8);
      uVar14 = (uVar9 ^ *(ulong *)(local_3b8 + lVar4 * 8)) & local_3c8._0_8_;
      uVar17 = (uVar11 ^ uVar3) & local_3c8._8_8_;
      *(ulong *)(local_3b8 + lVar4 * 8) = *(ulong *)(local_3b8 + lVar4 * 8) ^ uVar14;
      *(ulong *)(local_3b8 + lVar4 * 8 + 8) = uVar3 ^ uVar17;
      *(ulong *)(local_2b8 + lVar4 * 8) = uVar14 ^ uVar9;
      *(ulong *)(local_2b8 + lVar4 * 8 + 8) = uVar17 ^ uVar11;
      lVar4 = lVar4 + 2;
    } while (lVar4 != 0x10);
    bVar12 = uVar6 != 0;
    uVar6 = uVar6 - 1;
  } while (bVar12);
  puVar8 = (ulong *)local_3b8;
  puVar10 = local_338;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar10 = *puVar8;
    puVar8 = puVar8 + (ulong)bVar13 * -2 + 1;
    puVar10 = puVar10 + (ulong)bVar13 * -2 + 1;
  }
  iVar7 = 0xfd;
  do {
    mul((int64_t *)local_338,(int64_t *)local_338,(int64_t *)local_338);
    if ((iVar7 != 2) && (iVar7 != 4)) {
      mul((int64_t *)local_338,(int64_t *)local_338,(int64_t *)local_3b8);
    }
    bVar12 = iVar7 != 0;
    iVar7 = iVar7 + -1;
  } while (bVar12);
  puVar8 = local_338;
  puVar10 = (ulong *)local_3b8;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar10 = *puVar8;
    puVar8 = puVar8 + (ulong)bVar13 * -2 + 1;
    puVar10 = puVar10 + (ulong)bVar13 * -2 + 1;
  }
  mul((int64_t *)local_468,(int64_t *)local_468,(int64_t *)local_3b8);
  car25519((int64_t *)local_468);
  car25519((int64_t *)local_468);
  car25519((int64_t *)local_468);
  bVar12 = true;
  do {
    bVar5 = bVar12;
    uVar9 = local_468._0_8_ - 0xffed;
    local_338[0] = uVar9;
    lVar4 = 1;
    do {
      uVar11 = uVar9 & 0xffff;
      uVar9 = (((long)(uVar9 << 0x2f) >> 0x3f) + *(long *)(local_468 + lVar4 * 8)) - 0xffff;
      local_338[lVar4] = uVar9;
      local_338[lVar4 + -1] = uVar11;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0xf);
    local_2c0 = (local_3f8._8_8_ + ((long)(local_338[0xe] << 0x2f) >> 0x3f)) - 0x7fff;
    local_338[0xe] = local_338[0xe] & 0xffff;
    lVar4 = (local_2c0 >> 0x10 & 0xffff | 0xfffffffffffffffe) + 1;
    auVar16._8_4_ = (int)lVar4;
    auVar16._0_8_ = lVar4;
    auVar16._12_4_ = (int)((ulong)lVar4 >> 0x20);
    lVar4 = 0;
    do {
      auVar15 = *(undefined1 (*) [16])(local_338 + lVar4);
      auVar18 = (auVar15 ^ *(undefined1 (*) [16])(local_468 + lVar4 * 8)) & auVar16;
      *(undefined1 (*) [16])(local_468 + lVar4 * 8) =
           *(undefined1 (*) [16])(local_468 + lVar4 * 8) ^ auVar18;
      *(undefined1 (*) [16])(local_338 + lVar4) = auVar18 ^ auVar15;
      lVar4 = lVar4 + 2;
    } while (lVar4 != 0x10);
    bVar12 = false;
  } while (bVar5);
  lVar4 = 0;
  do {
    *(undefined2 *)(q + lVar4 * 2) = *(undefined2 *)(local_468 + lVar4 * 8);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  return;
}

Assistant:

void cf_curve25519_mul(uint8_t *q, const uint8_t *n, const uint8_t *p)
{
  uint8_t z[32];
  gf x;
  gf a, b, c, d, e, f;

  {
  size_t i;
  for (i = 0; i < 31; i++)
    z[i] = n[i];
  z[31] = (n[31] & 127) | 64;
  z[0] &= 248;
  
  unpack25519(x, p);

  for(i = 0; i < 16; i++)
  {
    b[i] = x[i];
    d[i] = a[i] = c[i] = 0;
  }
  }

  a[0] = d[0] = 1;

  {int i;
  for (i = 254; i >= 0; i--)
  {
    int64_t r = (z[i >> 3] >> (i & 7)) & 1;
    sel25519(a, b, r);
    sel25519(c, d, r);
    add(e, a, c);
    sub(a, a, c);
    add(c, b, d);
    sub(b, b, d);
    sqr(d, e);
    sqr(f, a);
    mul(a, c, a);
    mul(c, b, e);
    add(e, a, c);
    sub(a, a, c);
    sqr(b, a);
    sub(c, d, f);
    mul(a, c, _121665);
    add(a, a, d);
    mul(c, c, a);
    mul(a, d, f);
    mul(d, b, x);
    sqr(b, e);
    sel25519(a, b, r);
    sel25519(c, d, r);
  }
  }

  inv25519(c, c);
  mul(a, a, c);
  pack25519(q, a);
}